

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

QList<int> *
QFontDatabase::pointSizes(QList<int> *__return_storage_ptr__,QString *family,QString *styleName)

{
  ushort uVar1;
  QtFontFoundry *this;
  double dVar2;
  Data *pDVar3;
  int *piVar4;
  qsizetype qVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  Type *mutex;
  QtFontFamily *pQVar11;
  QtFontStyle *pQVar12;
  iterator iVar13;
  iterator iVar14;
  int j;
  long lVar15;
  long lVar16;
  int l;
  long lVar17;
  long in_FS_OFFSET;
  int pointSize;
  QArrayDataPointer<int> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  Key local_4c;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x80))
                    ((long *)CONCAT44(extraout_var,iVar8));
  if (cVar6 == '\0') {
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    parseFontName(family,(QString *)&local_88,(QString *)&local_68);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                        *)family);
    QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48,mutex);
    QFontDatabasePrivate::ensureFontDatabase();
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (int *)0x0;
    local_a8.size = 0;
    pQVar11 = QFontDatabasePrivate::family
                        (&QFontDatabasePrivate::instance::instance,(QString *)&local_68,
                         EnsurePopulated);
    if (pQVar11 == (QtFontFamily *)0x0) {
      local_a8.d = (Data *)0x0;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      local_a8.ptr = (int *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      local_a8.size = 0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      iVar8 = qt_defaultDpiY();
      local_4c = (Key)0xaaaaaaaa;
      QtFontStyle::Key::Key(&local_4c,styleName);
      for (lVar15 = 0; lVar15 < pQVar11->count; lVar15 = lVar15 + 1) {
        this = pQVar11->foundries[lVar15];
        if (local_88.size == 0) {
LAB_00428b3f:
          pQVar12 = QtFontFoundry::style(this,&local_4c,styleName,false);
          if (pQVar12 != (QtFontStyle *)0x0) {
            uVar10 = *(uint *)&pQVar12->field_0x4;
            if ((uVar10 & 2) != 0) {
              standardSizes();
              goto LAB_00428c73;
            }
            lVar16 = 8;
            for (lVar17 = 0; lVar17 < (int)uVar10 >> 2; lVar17 = lVar17 + 1) {
              uVar1 = *(ushort *)((long)&pQVar12->pixelSizes->handle + lVar16);
              if ((uVar1 != 0) && (uVar1 != 0xffff)) {
                dVar2 = ((double)uVar1 * 72.0) / (double)iVar8;
                pointSize = (int)((double)((ulong)dVar2 & 0x8000000000000000 | 0x3fe0000000000000) +
                                 dVar2);
                bVar7 = QListSpecialMethodsBase<int>::contains<int>
                                  ((QListSpecialMethodsBase<int> *)&local_a8,&pointSize);
                if (!bVar7) {
                  QList<int>::append((QList<int> *)&local_a8,pointSize);
                }
                uVar10 = *(uint *)&pQVar12->field_0x4;
              }
              lVar16 = lVar16 + 0x10;
            }
          }
        }
        else {
          iVar9 = QString::compare((QString *)this,(CaseSensitivity)&local_88);
          if (iVar9 == 0) goto LAB_00428b3f;
        }
      }
      iVar13 = QList<int>::begin((QList<int> *)&local_a8);
      iVar14 = QList<int>::end((QList<int> *)&local_a8);
      std::__sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar13.i,iVar14.i);
      qVar5 = local_a8.size;
      piVar4 = local_a8.ptr;
      pDVar3 = local_a8.d;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (int *)0x0;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = piVar4;
      local_a8.size = 0;
      (__return_storage_ptr__->d).size = qVar5;
    }
LAB_00428c73:
    QArrayDataPointer<int>::~QArrayDataPointer(&local_a8);
    QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00428cc6;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00428cc6:
      __stack_chk_fail();
    }
    standardSizes();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QFontDatabase::pointSizes(const QString &family,
                                     const QString &styleName)
{
    if (QGuiApplicationPrivate::platformIntegration()->fontDatabase()->fontsAlwaysScalable())
        return standardSizes();

    bool smoothScalable = false;
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QList<int> sizes;

    QtFontFamily *fam = d->family(familyName);
    if (!fam) return sizes;


    const int dpi = qt_defaultDpiY(); // embedded

    QtFontStyle::Key styleKey(styleName);
    for (int j = 0; j < fam->count; j++) {
        QtFontFoundry *foundry = fam->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            QtFontStyle *style = foundry->style(styleKey, styleName);
            if (!style) continue;

            if (style->smoothScalable) {
                smoothScalable = true;
                goto end;
            }
            for (int l = 0; l < style->count; l++) {
                const QtFontSize *size = style->pixelSizes + l;

                if (size->pixelSize != 0 && size->pixelSize != SMOOTH_SCALABLE) {
                    const int pointSize = qRound(size->pixelSize * 72.0 / dpi);
                    if (! sizes.contains(pointSize))
                        sizes.append(pointSize);
                }
            }
        }
    }
 end:
    if (smoothScalable)
        return standardSizes();

    std::sort(sizes.begin(), sizes.end());
    return sizes;
}